

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDressMapIds(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *vRes;
  void **ppvVar8;
  Vec_Int_t *__ptr;
  Vec_Int_t *__ptr_00;
  void *__s;
  void *__s_00;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  size_t __size;
  long lVar15;
  
  vRes = (Vec_Ptr_t *)malloc(0x10);
  vRes->nCap = 1000;
  vRes->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  vRes->pArray = ppvVar8;
  Abc_NtkDressMapSetPolarity(pNtk1);
  Abc_NtkDressMapSetPolarity(pNtk2);
  __ptr = Abc_NtkDressMapClasses(pMiter,pNtk1);
  __ptr_00 = Abc_NtkDressMapClasses(pMiter,pNtk2);
  pVVar4 = pMiter->vObjs;
  iVar2 = pVVar4->nSize;
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  if (iVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar7 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar2 * 4);
  }
  iVar7 = __ptr->nSize;
  lVar15 = (long)iVar7;
  if (0 < lVar15) {
    piVar10 = __ptr->pArray;
    lVar12 = 0;
    do {
      iVar3 = piVar10[lVar12];
      if (-1 < (long)iVar3) {
        if (iVar2 <= iVar3) goto LAB_002abc10;
        piVar1 = (int *)((long)__s + (long)iVar3 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar15 != lVar12);
  }
  iVar3 = pVVar4->nSize;
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  if (iVar5 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)iVar5 << 2);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,(long)iVar3 * 4);
  }
  iVar5 = __ptr_00->nSize;
  lVar12 = (long)iVar5;
  if (0 < lVar12) {
    piVar10 = __ptr_00->pArray;
    lVar13 = 0;
    do {
      iVar6 = piVar10[lVar13];
      if (-1 < (long)iVar6) {
        if (iVar3 <= iVar6) {
LAB_002abc10:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)__s_00 + (long)iVar6 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
  }
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  if (0 < iVar7) {
    piVar10 = __ptr->pArray;
    lVar13 = 0;
    do {
      if (piVar10[lVar13] == 0) {
        iVar6 = Abc_ObjDressMakeId(pNtk1,(int)lVar13,0);
        Vec_IntPush(pVVar9,iVar6);
      }
      lVar13 = lVar13 + 1;
    } while (lVar15 != lVar13);
  }
  if (0 < iVar5) {
    piVar10 = __ptr_00->pArray;
    lVar13 = 0;
    do {
      if (piVar10[lVar13] == 0) {
        iVar6 = Abc_ObjDressMakeId(pNtk2,(int)lVar13,1);
        Vec_IntPush(pVVar9,iVar6);
      }
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
  }
  vRes->nSize = 1;
  *vRes->pArray = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 0;
  pVVar9->nSize = 0;
  pVVar9->pArray = (int *)0x0;
  iVar6 = pMiter->vObjs->nSize;
  if (0 < (long)iVar6) {
    __size = (long)iVar6 << 2;
    piVar10 = (int *)malloc(__size);
    pVVar9->pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar9->nCap = iVar6;
    if (0 < iVar6) {
      memset(pVVar9->pArray,0xff,__size);
    }
  }
  pVVar9->nSize = iVar6;
  if (0 < iVar7) {
    piVar10 = __ptr->pArray;
    lVar13 = 0;
    do {
      iVar7 = piVar10[lVar13];
      lVar14 = (long)iVar7;
      if (0 < lVar14) {
        if (iVar2 <= iVar7) goto LAB_002abbf1;
        if (*(int *)((long)__s + lVar14 * 4) != 0) {
          if (iVar3 <= iVar7) goto LAB_002abbf1;
          if (*(int *)((long)__s_00 + lVar14 * 4) != 0) {
            pVVar11 = Abc_ObjDressClass(vRes,pVVar9,iVar7);
            iVar7 = Abc_ObjDressMakeId(pNtk1,(int)lVar13,0);
            Vec_IntPush(pVVar11,iVar7);
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar15 != lVar13);
  }
  if (0 < iVar5) {
    piVar10 = __ptr_00->pArray;
    lVar15 = 0;
    do {
      iVar7 = piVar10[lVar15];
      lVar13 = (long)iVar7;
      if (0 < lVar13) {
        if (iVar2 <= iVar7) goto LAB_002abbf1;
        if (*(int *)((long)__s + lVar13 * 4) != 0) {
          if (iVar3 <= iVar7) {
LAB_002abbf1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (*(int *)((long)__s_00 + lVar13 * 4) != 0) {
            pVVar11 = Abc_ObjDressClass(vRes,pVVar9,iVar7);
            iVar7 = Abc_ObjDressMakeId(pNtk2,(int)lVar15,1);
            Vec_IntPush(pVVar11,iVar7);
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar12 != lVar15);
  }
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (int *)0x0;
  }
  free(pVVar9);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  return vRes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDressMapIds( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vRes;
    Vec_Int_t * vId2Lit1, * vId2Lit2, * vCounts0, * vCounts1, * vClassC, * vClass2Num;
    int i, Class;
    // start the classes
    vRes = Vec_PtrAlloc( 1000 );
    // set polarity of the nodes
    Abc_NtkDressMapSetPolarity( pNtk1 );
    Abc_NtkDressMapSetPolarity( pNtk2 );
    // create mapping of node IDs of pNtk1/pNtk2 into the IDs of equiv classes of pMiter
    vId2Lit1 = Abc_NtkDressMapClasses( pMiter, pNtk1 );
    vId2Lit2 = Abc_NtkDressMapClasses( pMiter, pNtk2 );
    // count the number of nodes in each equivalence class
    vCounts0 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts0, Class, 1 );
    vCounts1 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts1, Class, 1 );
    // get the costant class
    vClassC = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk2, i, 1) );
    Vec_PtrPush( vRes, vClassC );
    // map repr node IDs into class numbers
    vClass2Num = Vec_IntAlloc( 0 );
    Vec_IntFill( vClass2Num, Aig_ManObjNumMax(pMiter), -1 );
    // keep classes having at least one element from pNtk1 and one from pNtk2
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk2, i, 1) );
    // package them accordingly
    Vec_IntFree( vClass2Num );
    Vec_IntFree( vCounts0 );
    Vec_IntFree( vCounts1 );
    Vec_IntFree( vId2Lit1 );
    Vec_IntFree( vId2Lit2 );
    return vRes;
}